

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRoundedCone.cpp
# Opt level: O1

void __thiscall
chrono::geometry::ChRoundedCone::ArchiveIN(ChRoundedCone *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> specFuncA;
  char *local_58;
  double *local_50;
  undefined1 local_48;
  undefined **local_40;
  ChVector<double> *local_38;
  
  ChArchiveIn::VersionRead<chrono::geometry::ChRoundedCone>(marchive);
  ChGeometry::ArchiveIN(&this->super_ChGeometry,marchive);
  local_38 = &this->center;
  local_40 = &PTR__ChFunctorArchiveIn_00b2ade0;
  local_58 = "center";
  local_48 = 0;
  local_50 = (double *)&local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->rad;
  local_40 = &PTR__ChFunctorArchiveIn_00b2ade0;
  local_58 = "rad";
  local_48 = 0;
  local_50 = (double *)&local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_50 = &this->radsphere;
  local_58 = "radsphere";
  local_48 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_58);
  return;
}

Assistant:

void ChRoundedCone::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChRoundedCone>();
    // deserialize parent class
    ChGeometry::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(center);
    marchive >> CHNVP(rad);
    marchive >> CHNVP(radsphere);
}